

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAnneal.c
# Opt level: O2

int cuddAnnealing(DdManager *table,int lower,int upper)

{
  uint uVar1;
  DdHalfWord x_low;
  int iVar2;
  int iVar3;
  int iVar4;
  DdHalfWord x_high;
  DdHalfWord y;
  DdHalfWord x;
  int iVar5;
  DdHalfWord y_00;
  int iVar6;
  int *array;
  ulong uVar7;
  ulong uVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  DdHalfWord x_00;
  int iVar14;
  DdHalfWord DVar15;
  int iVar16;
  DdNode *moves;
  int iVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int local_78;
  
  iVar2 = cuddSifting(table,lower,upper);
  if (iVar2 != 0) {
    iVar2 = upper - lower;
    iVar3 = iVar2 + 1;
    uVar1 = table->keys;
    local_78 = table->isolated;
    array = (int *)malloc((long)iVar3 << 2);
    if (array != (int *)0x0) {
      local_78 = uVar1 - local_78;
      copyOrder(table,array,lower,upper);
      dVar21 = (double)local_78 * 0.6;
      iVar4 = iVar3 * 0xf;
      iVar16 = local_78 + 10;
      iVar14 = local_78 + 0x14;
      iVar13 = local_78 + 0x1e;
      iVar6 = local_78;
      iVar17 = local_78;
      do {
        iVar11 = iVar16;
        iVar12 = 0;
        if (0 < iVar4) {
          iVar12 = iVar4;
        }
        do {
          iVar16 = iVar14;
          iVar14 = iVar17;
          iVar17 = iVar13;
          iVar13 = iVar6;
          dVar20 = dVar21;
          if ((dVar20 <= 1.0) && (iVar11 == iVar17 && (iVar11 == iVar14 && iVar11 == iVar16))) {
            lVar18 = 0;
            goto LAB_0064388c;
          }
          iVar6 = 0;
LAB_0064346b:
          if (iVar6 != iVar12) {
            uVar7 = Cudd_Random();
            do {
              uVar8 = Cudd_Random();
              iVar11 = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff)
                            % (long)iVar3);
              iVar13 = (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff)
                            % (long)iVar3);
            } while (iVar11 == iVar13);
            x_high = iVar11 + lower;
            x_low = lower + iVar13;
            if (iVar11 <= iVar13) {
              x_low = x_high;
              x_high = lower + iVar13;
            }
            dVar21 = random_generator();
            if (dVar21 < 0.4) {
              y = cuddNextHigh(table,x_low);
              x = cuddNextLow(table,x_high);
              iVar11 = table->keys - table->isolated;
              moves = (DdNode *)0x0;
              iVar13 = iVar11;
              DVar15 = x_low;
              y_00 = x_high;
              do {
                if (y == x) {
                  iVar5 = cuddSwapInPlace(table,DVar15,y);
                  if ((iVar5 == 0) ||
                     (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0))
                  goto LAB_0064392c;
                  pDVar9->index = DVar15;
                  pDVar9->ref = y;
                  *(int *)((long)&pDVar9->next + 4) = iVar5;
                  (pDVar9->type).kids.T = moves;
                  iVar5 = cuddSwapInPlace(table,y,y_00);
                  moves = pDVar9;
                  if ((iVar5 == 0) ||
                     (pDVar10 = cuddDynamicAllocNode(table), pDVar10 == (DdNode *)0x0))
                  goto LAB_0064392c;
                  pDVar10->index = y;
                  pDVar10->ref = y_00;
                  *(int *)((long)&pDVar10->next + 4) = iVar5;
                  (pDVar10->type).kids.T = pDVar9;
                  x = DVar15;
LAB_0064359a:
                  iVar5 = cuddSwapInPlace(table,x,y);
                  moves = pDVar10;
                  if ((iVar5 == 0) ||
                     (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0))
                  goto LAB_0064392c;
                  pDVar9->index = x;
                  moves = pDVar9;
                  DVar15 = y_00;
                  y_00 = y;
                  x_00 = x;
                }
                else {
                  pDVar10 = moves;
                  if (DVar15 == x) goto LAB_0064359a;
                  iVar5 = cuddSwapInPlace(table,DVar15,y);
                  if ((iVar5 == 0) ||
                     (pDVar10 = cuddDynamicAllocNode(table), pDVar10 == (DdNode *)0x0))
                  goto LAB_0064392c;
                  pDVar10->index = DVar15;
                  pDVar10->ref = y;
                  *(int *)((long)&pDVar10->next + 4) = iVar5;
                  (pDVar10->type).kids.T = moves;
                  iVar5 = cuddSwapInPlace(table,x,y_00);
                  moves = pDVar10;
                  if ((iVar5 == 0) ||
                     (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0))
                  goto LAB_0064392c;
                  pDVar9->index = x;
                  moves = pDVar9;
                  DVar15 = y;
                  x_00 = x;
                }
                moves->ref = y_00;
                *(int *)((long)&moves->next + 4) = iVar5;
                (moves->type).kids.T = pDVar10;
                y = cuddNextHigh(table,DVar15);
                x = cuddNextLow(table,x_00);
                if (((int)x_high < (int)y) || ((double)iVar13 * 1.1 < (double)iVar5))
                goto LAB_006436e7;
                y_00 = x_00;
                if (iVar5 < iVar13) {
                  iVar13 = iVar5;
                }
              } while( true );
            }
            DVar15 = x_low;
            if (dVar21 < 0.76) {
              DVar15 = x_high;
            }
            iVar13 = ddJumpingAux(table,DVar15,x_low,x_high,dVar20);
            if (iVar13 != 0) goto LAB_00643798;
            goto LAB_00643931;
          }
          dVar21 = dVar20 * 0.9;
          iVar6 = iVar13;
          iVar11 = iVar16;
        } while (dVar21 < 1.0);
        dVar19 = log(dVar21);
        dVar20 = log(dVar20);
        iVar4 = (int)((double)iVar4 * (dVar19 / dVar20));
      } while( true );
    }
    table->errorCode = CUDD_MEMORY_OUT;
  }
  return 0;
LAB_0064388c:
  if (iVar2 < lVar18) {
LAB_006438e7:
    free(array);
    return (uint)(iVar2 < lVar18);
  }
  iVar3 = table->perm[array[lVar18]];
  iVar14 = cuddNextLow(table,iVar3);
  while (iVar6 = iVar14, lVar18 + lower <= (long)iVar6) {
    iVar3 = cuddSwapInPlace(table,iVar6,iVar3);
    if (iVar3 == 0) goto LAB_006438e7;
    iVar14 = cuddNextLow(table,iVar6);
    iVar3 = iVar6;
  }
  lVar18 = lVar18 + 1;
  goto LAB_0064388c;
LAB_006436e7:
  if ((int)x_low <= (int)x) {
    iVar13 = cuddSwapInPlace(table,x,x_00);
    if ((iVar13 == 0) || (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0)) {
LAB_0064392c:
      while (moves != (DdNode *)0x0) {
        pDVar9 = (moves->type).kids.T;
        moves->ref = 0;
        moves->next = table->nextFree;
        table->nextFree = moves;
        moves = pDVar9;
      }
LAB_00643931:
      free(array);
      return 0;
    }
    pDVar9->index = x;
    pDVar9->ref = x_00;
    *(int *)((long)&pDVar9->next + 4) = iVar13;
    (pDVar9->type).kids.T = moves;
    moves = pDVar9;
  }
  iVar13 = siftBackwardProb(table,(Move *)moves,iVar11,dVar20);
  if (iVar13 == 0) goto LAB_0064392c;
  pDVar9 = table->nextFree;
  while (moves != (DdNode *)0x0) {
    pDVar10 = (moves->type).kids.T;
    moves->ref = 0;
    moves->next = pDVar9;
    pDVar9 = moves;
    moves = pDVar10;
  }
  table->nextFree = pDVar9;
LAB_00643798:
  iVar13 = table->keys - table->isolated;
  if (iVar13 < local_78) {
    copyOrder(table,array,lower,upper);
    local_78 = iVar13;
  }
  iVar6 = iVar6 + 1;
  goto LAB_0064346b;
}

Assistant:

int
cuddAnnealing(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         nvars;
    int         size;
    int         x,y;
    int         result;
    int         c1, c2, c3, c4;
    int         BestCost;
    int         *BestOrder;
    double      NewTemp, temp;
    double      rand1;
    int         innerloop, maxGen;
    int         ecount, ucount, dcount;
   
    nvars = upper - lower + 1;

    result = cuddSifting(table,lower,upper);
#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
#endif
    if (result == 0) return(0);

    size = table->keys - table->isolated;

    /* Keep track of the best order. */
    BestCost = size;
    BestOrder = ABC_ALLOC(int,nvars);
    if (BestOrder == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    copyOrder(table,BestOrder,lower,upper);

    temp = BETA * size;
    maxGen = (int) (MAXGEN_RATIO * nvars);

    c1 = size + 10;
    c2 = c1 + 10;
    c3 = size;
    c4 = c2 + 10;
    ecount = ucount = dcount = 0;
 
    while (!stopping_criterion(c1, c2, c3, c4, temp)) {
#ifdef DD_STATS
        (void) fprintf(table->out,"temp=%f\tsize=%d\tgen=%d\t",
                       temp,size,maxGen);
        tosses = acceptances = 0;
#endif
        for (innerloop = 0; innerloop < maxGen; innerloop++) {
            /* Choose x, y  randomly. */
            x = (int) Cudd_Random() % nvars;
            do {
                y = (int) Cudd_Random() % nvars;
            } while (x == y);
            x += lower;
            y += lower;
            if (x > y) {
                int tmp = x;
                x = y;
                y = tmp;
            }

            /* Choose move with roulette wheel. */
            rand1 = random_generator();
            if (rand1 < EXC_PROB) {
                result = ddExchange(table,x,y,temp);       /* exchange */
                ecount++;
#if 0
                (void) fprintf(table->out,
                               "Exchange of %d and %d: size = %d\n",
                               x,y,table->keys - table->isolated);
#endif
            } else if (rand1 < EXC_PROB + JUMP_UP_PROB) {
                result = ddJumpingAux(table,y,x,y,temp); /* jumping_up */
                ucount++;
#if 0
                (void) fprintf(table->out,
                               "Jump up of %d to %d: size = %d\n",
                               y,x,table->keys - table->isolated);
#endif
            } else {
                result = ddJumpingAux(table,x,x,y,temp); /* jumping_down */
                dcount++;
#if 0
                (void) fprintf(table->out,
                               "Jump down of %d to %d: size = %d\n",
                               x,y,table->keys - table->isolated);
#endif
            }

            if (!result) {
                ABC_FREE(BestOrder);
                return(0);
            }

            size = table->keys - table->isolated;       /* keep current size */
            if (size < BestCost) {                      /* update best order */
                BestCost = size;
                copyOrder(table,BestOrder,lower,upper);
            }
        }
        c1 = c2;
        c2 = c3;
        c3 = c4;
        c4 = size;
        NewTemp = ALPHA * temp;
        if (NewTemp >= 1.0) {
            maxGen = (int)(log(NewTemp) / log(temp) * maxGen);
        }
        temp = NewTemp;                 /* control variable */
#ifdef DD_STATS
        (void) fprintf(table->out,"uphill = %d\taccepted = %d\n",
                       tosses,acceptances);
        fflush(table->out);
#endif
    }

    result = restoreOrder(table,BestOrder,lower,upper);
    ABC_FREE(BestOrder);
    if (!result) return(0);
#ifdef DD_STATS
    fprintf(table->out,"#:N_EXCHANGE %8d : total exchanges\n",ecount);
    fprintf(table->out,"#:N_JUMPUP   %8d : total jumps up\n",ucount);
    fprintf(table->out,"#:N_JUMPDOWN %8d : total jumps down",dcount);
#endif
    return(1);

}